

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void TransformOne_C(int16_t *in,uint8_t *dst)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  byte *in_RSI;
  short *in_RDI;
  int d_1;
  int c_1;
  int b_1;
  int a_1;
  int dc;
  int d;
  int c;
  int b;
  int a;
  int i;
  int *tmp;
  int C [16];
  int local_64;
  int *local_60;
  int local_58 [18];
  byte *local_10;
  short *local_8;
  
  local_60 = local_58;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    sVar1 = *local_8;
    sVar2 = local_8[8];
    sVar3 = *local_8;
    sVar4 = local_8[8];
    iVar6 = (local_8[4] * 0x8a8c >> 0x10) - ((local_8[0xc] * 0x4e7b >> 0x10) + (int)local_8[0xc]);
    iVar7 = (local_8[4] * 0x4e7b >> 0x10) + (int)local_8[4] + (local_8[0xc] * 0x8a8c >> 0x10);
    *local_60 = (int)sVar1 + (int)sVar2 + iVar7;
    local_60[1] = ((int)sVar3 - (int)sVar4) + iVar6;
    local_60[2] = ((int)sVar3 - (int)sVar4) - iVar6;
    local_60[3] = ((int)sVar1 + (int)sVar2) - iVar7;
    local_60 = local_60 + 4;
    local_8 = local_8 + 1;
  }
  local_60 = local_58;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    iVar6 = *local_60 + 4 + local_60[8];
    iVar7 = (*local_60 + 4) - local_60[8];
    iVar8 = (local_60[4] * 0x8a8c >> 0x10) - ((local_60[0xc] * 0x4e7b >> 0x10) + local_60[0xc]);
    iVar9 = (local_60[4] * 0x4e7b >> 0x10) + local_60[4] + (local_60[0xc] * 0x8a8c >> 0x10);
    bVar5 = clip_8b((uint)*local_10 + (iVar6 + iVar9 >> 3));
    *local_10 = bVar5;
    bVar5 = clip_8b((uint)local_10[1] + (iVar7 + iVar8 >> 3));
    local_10[1] = bVar5;
    bVar5 = clip_8b((uint)local_10[2] + (iVar7 - iVar8 >> 3));
    local_10[2] = bVar5;
    bVar5 = clip_8b((uint)local_10[3] + (iVar6 - iVar9 >> 3));
    local_10[3] = bVar5;
    local_60 = local_60 + 1;
    local_10 = local_10 + 0x20;
  }
  return;
}

Assistant:

static void TransformOne_C(const int16_t* in, uint8_t* dst) {
  int C[4 * 4], *tmp;
  int i;
  tmp = C;
  for (i = 0; i < 4; ++i) {    // vertical pass
    const int a = in[0] + in[8];    // [-4096, 4094]
    const int b = in[0] - in[8];    // [-4095, 4095]
    const int c = MUL2(in[4]) - MUL1(in[12]);   // [-3783, 3783]
    const int d = MUL1(in[4]) + MUL2(in[12]);   // [-3785, 3781]
    tmp[0] = a + d;   // [-7881, 7875]
    tmp[1] = b + c;   // [-7878, 7878]
    tmp[2] = b - c;   // [-7878, 7878]
    tmp[3] = a - d;   // [-7877, 7879]
    tmp += 4;
    in++;
  }
  // Each pass is expanding the dynamic range by ~3.85 (upper bound).
  // The exact value is (2. + (20091 + 35468) / 65536).
  // After the second pass, maximum interval is [-3794, 3794], assuming
  // an input in [-2048, 2047] interval. We then need to add a dst value
  // in the [0, 255] range.
  // In the worst case scenario, the input to clip_8b() can be as large as
  // [-60713, 60968].
  tmp = C;
  for (i = 0; i < 4; ++i) {    // horizontal pass
    const int dc = tmp[0] + 4;
    const int a =  dc +  tmp[8];
    const int b =  dc -  tmp[8];
    const int c = MUL2(tmp[4]) - MUL1(tmp[12]);
    const int d = MUL1(tmp[4]) + MUL2(tmp[12]);
    STORE(0, 0, a + d);
    STORE(1, 0, b + c);
    STORE(2, 0, b - c);
    STORE(3, 0, a - d);
    tmp++;
    dst += BPS;
  }
}